

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O0

void route_ended(tgestate_t *state,vischar_t *vischar,route_t *route)

{
  byte bVar1;
  route_t *in_RDX;
  tgestate_t *in_RSI;
  vischar_t *in_RDI;
  tgestate_t *unaff_retaddr;
  character_t character;
  
  if ((in_RDX == &in_RDI[0xf].route) ||
     (((bVar1 = (byte)in_RSI->width, bVar1 == 0 && ((in_RDX->index & 0x7f) == 0x24)) ||
      (0xb < bVar1)))) {
    character_event(in_RSI,in_RDX);
    if (in_RDX->index != '\0') {
      get_target_assign_pos(unaff_retaddr,in_RDI,(route_t *)in_RSI);
    }
  }
  else {
    in_RDX->index = in_RDX->index ^ 0x80;
    if ((in_RDX->index & 0x80) == 0) {
      in_RDX->step = in_RDX->step + '\x01';
    }
    else {
      in_RDX->step = in_RDX->step + 0xff;
    }
  }
  return;
}

Assistant:

void route_ended(tgestate_t *state, vischar_t *vischar, route_t *route)
{
  assert(state != NULL);
  ASSERT_VISCHAR_VALID(vischar);
  assert(route != NULL);
  ASSERT_ROUTE_VALID(*route);

#ifdef DEBUG_ROUTES
  if (vischar == &state->vischars[0])
    printf("(hero) route_ended\n");
#endif

  /* If not the hero's vischar ... */
  if (route != &state->vischars[0].route) /* Conv: was (L != 2) */
  {
    character_t character; /* was A */

    character = vischar->character; /* Conv: Removed redundant mask op. */
    assert(character != character_NONE);

    /* Call character_event at the end of commandant route 36. */
    if (character == character_0_COMMANDANT)
      if ((route->index & ~ROUTEINDEX_REVERSE_FLAG) == routeindex_36_GO_TO_SOLITARY)
        goto do_character_event;

    /* Reverse the route for guards 1..11. */
    // Guards 1..11 have fixed roles so either stand still or march back and forth along their route.
    if (character <= character_11_GUARD_11)
      goto reverse_route;
  }

do_character_event:
  /* We arrive here if:
   * - vischar is the hero, or
   * - character is character_0_COMMANDANT and route index is 36, or
   * - character is >= character_12_GUARD_12
   */

  character_event(state, route);
  if (route->index != routeindex_0_HALT) /* standing still */
    get_target_assign_pos(state, vischar, route); // re-enter
  return;

reverse_route:
  /* We arrive here if:
   * - vischar is not the hero, and
   *   - character is character_0_COMMANDANT and route index is not 36, or
   *   - character is character_1_GUARD_1 .. character_11_GUARD_11
   */

  route->index ^= ROUTEINDEX_REVERSE_FLAG; /* toggle route direction */
  // Conv: Removed [-2]+1 pattern.
  if (route->index & ROUTEINDEX_REVERSE_FLAG)
    route->step--;
  else
    route->step++;
}